

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O3

bool __thiscall QLCDNumber::checkOverflow(QLCDNumber *this,int num)

{
  long lVar1;
  long in_FS_OFFSET;
  bool of;
  QString local_30;
  bool local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  local_11 = true;
  int2string(&local_30,num,*(byte *)(lVar1 + 0x288) & 3,*(int *)(lVar1 + 0x278),&local_11);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QLCDNumber::checkOverflow(int num) const
{
    Q_D(const QLCDNumber);
    bool of;
    int2string(num, d->base, d->ndigits, &of);
    return of;
}